

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnData::AppendTransientSegment(ColumnData *this,SegmentLock *l,idx_t start_row)

{
  BlockManager *pBVar1;
  DatabaseInstance *db;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var2;
  ColumnSegment *pCVar3;
  idx_t iVar4;
  idx_t iVar5;
  unsigned_long uVar6;
  DBConfig *this_00;
  ulong uVar7;
  ulong segment_size;
  optional_ptr<duckdb::CompressionFunction,_true> function;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_50;
  ColumnSegment *local_48;
  __atomic_base<unsigned_long> local_40;
  atomic<duckdb::ColumnSegment_*> local_38;
  
  pBVar1 = this->block_manager;
  local_40._M_i = (__int_type)l;
  iVar4 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar5 = optional_idx::GetIndex(&pBVar1->block_header_size);
  uVar7 = iVar4 - iVar5;
  iVar4 = GetTypeIdSize((this->type).physical_type_);
  uVar6 = NumericCastImpl<unsigned_long,_long,_false>::Convert(0x7ffffffffff080);
  segment_size = iVar4 << 0xb;
  if (uVar6 != start_row) {
    segment_size = uVar7;
  }
  if (uVar7 < segment_size) {
    segment_size = uVar7;
  }
  this->allocation_size = this->allocation_size + segment_size;
  db = this->info->db->db;
  this_00 = DBConfig::GetConfig(db);
  local_38._M_b._M_p =
       (__base_type)
       DBConfig::GetCompressionFunction
                 (this_00,COMPRESSION_UNCOMPRESSED,(this->type).physical_type_);
  optional_ptr<duckdb::CompressionFunction,_true>::CheckValid
            ((optional_ptr<duckdb::CompressionFunction,_true> *)&stack0xffffffffffffffc8);
  ColumnSegment::CreateTransientSegment
            ((ColumnSegment *)&stack0xffffffffffffffb8,db,(CompressionFunction *)local_38._M_b._M_p,
             &this->type,start_row,segment_size,this->block_manager);
  local_50._M_head_impl = local_48;
  local_48 = (ColumnSegment *)0x0;
  AppendSegment(this,(SegmentLock *)local_40._M_i,
                (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                 *)&local_50);
  _Var2._M_head_impl = local_50._M_head_impl;
  if (local_50._M_head_impl != (ColumnSegment *)0x0) {
    ColumnSegment::~ColumnSegment(local_50._M_head_impl);
    operator_delete(_Var2._M_head_impl);
  }
  pCVar3 = local_48;
  local_50._M_head_impl = (ColumnSegment *)0x0;
  if (local_48 != (ColumnSegment *)0x0) {
    ColumnSegment::~ColumnSegment(local_48);
    operator_delete(pCVar3);
  }
  return;
}

Assistant:

void ColumnData::AppendTransientSegment(SegmentLock &l, idx_t start_row) {

	const auto block_size = block_manager.GetBlockSize();
	const auto type_size = GetTypeIdSize(type.InternalType());
	auto vector_segment_size = block_size;

	if (start_row == NumericCast<idx_t>(MAX_ROW_ID)) {
#if STANDARD_VECTOR_SIZE < 1024
		vector_segment_size = 1024 * type_size;
#else
		vector_segment_size = STANDARD_VECTOR_SIZE * type_size;
#endif
	}

	// The segment size is bound by the block size, but can be smaller.
	idx_t segment_size = block_size < vector_segment_size ? block_size : vector_segment_size;
	allocation_size += segment_size;

	auto &db = GetDatabase();
	auto &config = DBConfig::GetConfig(db);
	auto function = config.GetCompressionFunction(CompressionType::COMPRESSION_UNCOMPRESSED, type.InternalType());

	auto new_segment =
	    ColumnSegment::CreateTransientSegment(db, *function, type, start_row, segment_size, block_manager);
	AppendSegment(l, std::move(new_segment));
}